

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_pcallk(lua_State *L,int nargs,int nresults,int errfunc,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *pCVar1;
  StkId pSVar2;
  CallInfo *ci;
  StkId o;
  ptrdiff_t func;
  StkId pSStack_40;
  int status;
  CallS c;
  lua_KFunction k_local;
  lua_KContext ctx_local;
  int errfunc_local;
  int nresults_local;
  int nargs_local;
  lua_State *L_local;
  
  c._8_8_ = k;
  if (errfunc == 0) {
    o = (StkId)0x0;
  }
  else {
    pSVar2 = index2stack(L,errfunc);
    o = (StkId)((long)pSVar2 - (L->stack).offset);
  }
  pSStack_40 = (L->top).p + -(long)(nargs + 1);
  if ((c._8_8_ == 0) || ((L->nCcalls & 0xffff0000) != 0)) {
    c.func._0_4_ = nresults;
    func._4_4_ = luaD_pcall(L,f_call,&stack0xffffffffffffffc0,(long)pSStack_40 - (L->stack).offset,
                            (ptrdiff_t)o);
  }
  else {
    pCVar1 = L->ci;
    (pCVar1->u).l.savedpc = (Instruction *)c._8_8_;
    (pCVar1->u).c.ctx = ctx;
    (pCVar1->u2).funcidx = (int)pSStack_40 - (int)(L->stack).offset;
    (pCVar1->u).c.old_errfunc = L->errfunc;
    L->errfunc = (ptrdiff_t)o;
    pCVar1->callstatus = pCVar1->callstatus & 0xfffe | (ushort)L->allowhook;
    pCVar1->callstatus = pCVar1->callstatus | 0x10;
    luaD_call(L,pSStack_40,nresults);
    pCVar1->callstatus = pCVar1->callstatus & 0xffef;
    L->errfunc = (pCVar1->u).c.old_errfunc;
    func._4_4_ = 0;
  }
  if ((0x7fffffff < (uint)nresults) && ((L->ci->top).p < (L->top).p)) {
    L->ci->top = L->top;
  }
  return func._4_4_;
}

Assistant:

LUA_API int lua_pcallk (lua_State *L, int nargs, int nresults, int errfunc,
                        lua_KContext ctx, lua_KFunction k) {
  struct CallS c;
  int status;
  ptrdiff_t func;
  lua_lock(L);
  api_check(L, k == NULL || !isLua(L->ci),
    "cannot use continuations inside hooks");
  api_checknelems(L, nargs+1);
  api_check(L, L->status == LUA_OK, "cannot do calls on non-normal thread");
  checkresults(L, nargs, nresults);
  if (errfunc == 0)
    func = 0;
  else {
    StkId o = index2stack(L, errfunc);
    api_check(L, ttisfunction(s2v(o)), "error handler must be a function");
    func = savestack(L, o);
  }
  c.func = L->top.p - (nargs+1);  /* function to be called */
  if (k == NULL || !yieldable(L)) {  /* no continuation or no yieldable? */
    c.nresults = nresults;  /* do a 'conventional' protected call */
    status = luaD_pcall(L, f_call, &c, savestack(L, c.func), func);
  }
  else {  /* prepare continuation (call is already protected by 'resume') */
    CallInfo *ci = L->ci;
    ci->u.c.k = k;  /* save continuation */
    ci->u.c.ctx = ctx;  /* save context */
    /* save information for error recovery */
    ci->u2.funcidx = cast_int(savestack(L, c.func));
    ci->u.c.old_errfunc = L->errfunc;
    L->errfunc = func;
    setoah(ci->callstatus, L->allowhook);  /* save value of 'allowhook' */
    ci->callstatus |= CIST_YPCALL;  /* function can do error recovery */
    luaD_call(L, c.func, nresults);  /* do the call */
    ci->callstatus &= ~CIST_YPCALL;
    L->errfunc = ci->u.c.old_errfunc;
    status = LUA_OK;  /* if it is here, there were no errors */
  }
  adjustresults(L, nresults);
  lua_unlock(L);
  return status;
}